

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmopn2612.c
# Opt level: O1

void ym2612_setoptions(void *chip,UINT32 Flags)

{
  *(byte *)((long)chip + 0x50b1) = (byte)Flags >> 2 & 1;
  *(byte *)((long)chip + 0x209) = (byte)Flags >> 7;
  return;
}

Assistant:

void ym2612_setoptions(void *chip, UINT32 Flags)
{
	YM2612 *F2612 = (YM2612 *)chip;
	UINT8 PseudoStereo;
	
	PseudoStereo = (Flags >> 2) & 0x01;
	F2612->WaveOutMode = (PseudoStereo) ? 0x01 : 0x00;
	F2612->OPN.LegacyMode = (Flags >> 7) & 0x01;
	
	return;
}